

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalBatchCopyToFile::Finalize
          (PhysicalBatchCopyToFile *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  FixedBatchCopyGlobalState *__args_1;
  GlobalSinkState *gstate_p;
  bool bVar1;
  idx_t iVar2;
  shared_ptr<duckdb::ProcessRemainingBatchesEvent,_true> new_event;
  undefined1 local_69;
  shared_ptr<duckdb::ProcessRemainingBatchesEvent,_true> local_68;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::ProcessRemainingBatchesEvent> local_40;
  
  __args_1 = (FixedBatchCopyGlobalState *)input->global_state;
  RepartitionBatches(this,context,(GlobalSinkState *)__args_1,0x7fffffffffffffff,true);
  iVar2 = BatchTaskManager<duckdb::BatchCopyTask>::TaskCount(&__args_1->task_manager);
  if (iVar2 < 2) {
    gstate_p = input->global_state;
    do {
      bVar1 = ExecuteTask(this,context,gstate_p);
    } while (bVar1);
    FinalFlush(this,context,input->global_state);
  }
  else {
    local_40.super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ProcessRemainingBatchesEvent,std::allocator<duckdb::ProcessRemainingBatchesEvent>,duckdb::PhysicalBatchCopyToFile_const&,duckdb::FixedBatchCopyGlobalState&,duckdb::Pipeline&,duckdb::ClientContext&>
              (&local_40.
                super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(ProcessRemainingBatchesEvent **)&local_40,
               (allocator<duckdb::ProcessRemainingBatchesEvent> *)&local_69,this,__args_1,pipeline,
               context);
    shared_ptr<duckdb::ProcessRemainingBatchesEvent,_true>::shared_ptr(&local_68,&local_40);
    if (local_40.
        super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_68.internal.
         super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_68.internal.
            super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    local_68.internal.
    super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.internal.
    super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Event::InsertEvent(event,&local_58);
    if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.internal.
        super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.internal.
                 super___shared_ptr<duckdb::ProcessRemainingBatchesEvent,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalBatchCopyToFile::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                   OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto min_batch_index = idx_t(NumericLimits<int64_t>::Maximum());
	// repartition any remaining batches
	RepartitionBatches(context, input.global_state, min_batch_index, true);
	// check if we have multiple tasks to execute
	if (gstate.task_manager.TaskCount() <= 1) {
		// we don't - just execute the remaining task and finish flushing to disk
		ExecuteTasks(context, input.global_state);
		FinalFlush(context, input.global_state);
	} else {
		// we have multiple tasks remaining - launch an event to execute the tasks in parallel
		auto new_event = make_shared_ptr<ProcessRemainingBatchesEvent>(*this, gstate, pipeline, context);
		event.InsertEvent(std::move(new_event));
	}
	return SinkFinalizeType::READY;
}